

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O2

void Am_Start_Interactor(Am_Object *inter,Am_Object *start_obj,Am_Input_Char start_char,
                        Am_Object *start_window,int start_x,int start_y,bool update_now)

{
  bool bVar1;
  Am_Inter_State AVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  int start_y_local;
  int start_x_local;
  Am_Input_Char start_char_local;
  Am_Object local_78;
  Am_Object local_70;
  Am_Input_Event ev;
  Am_Inter_Internal_Method method;
  
  start_y_local = start_y;
  start_x_local = start_x;
  start_char_local = start_char;
  Am_Object::Am_Object(&local_70,inter);
  AVar2 = Am_Get_Inter_State(&local_70);
  Am_Object::~Am_Object(&local_70);
  if (AVar2 == Am_INTER_WAITING) {
    Am_Object::Am_Object(&local_78,inter);
    Check_And_Handle_Trace_Next_Inter(&local_78);
    Am_Object::~Am_Object(&local_78);
    bVar1 = Am_Object::Valid(start_obj);
    if (!bVar1) {
      Am_Object::Get_Owner((Am_Object *)&ev,(Am_Slot_Flags)inter);
      Am_Object::operator=(start_obj,(Am_Object *)&ev);
      Am_Object::~Am_Object((Am_Object *)&ev);
    }
    bVar1 = Am_Object::Valid(start_window);
    if ((!bVar1) && (bVar1 = Am_Object::Valid(start_obj), bVar1)) {
      pAVar3 = Am_Object::Get(start_obj,0x68,0);
      Am_Object::operator=(start_window,pAVar3);
      bVar1 = Am_Object::Valid(start_window);
      if ((!bVar1) ||
         (bVar1 = Am_Translate_Coordinates(start_obj,0,0,start_window,&start_x_local,&start_y_local)
         , !bVar1)) {
        pAVar3 = Am_Object::Get(start_obj,100,0);
        start_x_local = Am_Value::operator_cast_to_int(pAVar3);
        pAVar3 = Am_Object::Get(start_obj,0x65,0);
        start_y_local = Am_Value::operator_cast_to_int(pAVar3);
      }
    }
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(start_window);
    Am_Object::Set(inter,0x68,pAVar4,0);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(start_obj);
    Am_Object::Set(inter,0x11a,pAVar4,0);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(start_obj);
    Am_Object::Set(inter,0x119,pAVar4,0);
    Am_Input_Char::operator_cast_to_Am_Value(&start_char_local);
    Am_Object::Set(inter,0x11b,(Am_Value *)&ev,0);
    Am_Value::~Am_Value((Am_Value *)&ev);
    Am_Object::Set(inter,0x11f,start_x_local,0);
    Am_Object::Set(inter,0x120,start_y_local,0);
    Am_Input_Event::Am_Input_Event(&ev);
    Am_Input_Char::operator=(&ev.input_char,&start_char_local);
    ev.x = start_x_local;
    ev.y = start_y_local;
    ev.draw = (Am_Drawonable *)0x0;
    ev.time_stamp = 0;
    method.from_wrapper = (Am_Method_Wrapper *)0x0;
    method.Call = (Am_Inter_Internal_Method_Type *)0x0;
    pAVar3 = Am_Object::Get(inter,0xbe,0);
    Am_Inter_Internal_Method::operator=(&method,pAVar3);
    (*method.Call)(inter,start_obj,start_window,&ev);
    if (update_now) {
      do_update();
    }
    Am_Value::~Am_Value(&ev.user_id);
    return;
  }
  return;
}

Assistant:

void
Am_Start_Interactor(Am_Object inter, Am_Object start_obj,
                    Am_Input_Char start_char, Am_Object start_window,
                    int start_x, int start_y, bool update_now)
{

  Am_Inter_State state = Am_Get_Inter_State(inter);
  if (state != Am_INTER_WAITING)
    return;

  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Explicitly Starting " << inter);
  Check_And_Handle_Trace_Next_Inter(inter);
  if (!start_obj.Valid())
    start_obj = inter.Get_Owner();
  if (!start_window.Valid() && start_obj.Valid()) {
    start_window = start_obj.Get(Am_WINDOW);
    if (start_window.Valid() &&
        Am_Translate_Coordinates(start_obj, 0, 0, start_window, start_x,
                                 start_y))
      //then have pos of start_obj in start_window
      ;
    else {
      start_x = start_obj.Get(Am_LEFT);
      start_y = start_obj.Get(Am_TOP);
    }
  }
  //now start the interactor
  inter.Set(Am_WINDOW, start_window);
  inter.Set(Am_START_OBJECT, start_obj);
  inter.Set(Am_CURRENT_OBJECT, start_obj);
  inter.Set(Am_START_CHAR, start_char);
  inter.Set(Am_FIRST_X, start_x);
  inter.Set(Am_FIRST_Y, start_y);
  Am_Input_Event ev;
  ev.input_char = start_char;
  ev.x = start_x;
  ev.y = start_y;
  ev.draw = nullptr;
  ev.time_stamp = 0;
  Am_Inter_Internal_Method method;
  method = inter.Get(Am_INTER_START_METHOD);
  method.Call(inter, start_obj, start_window, &ev);
  if (update_now)
    do_update();
}